

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O3

FederateState * __thiscall
helics::CommonCore::getHandleFederateCore(CommonCore *this,InterfaceHandle handle)

{
  shared_mutex *__rwlock;
  LocalFederateId LVar1;
  FederateState *pFVar2;
  
  __rwlock = &(this->handles).m_mutex;
  std::__shared_mutex_pthread::lock_shared(&__rwlock->_M_impl);
  LVar1 = HandleManager::getLocalFedID(&(this->handles).m_obj,handle);
  pthread_rwlock_unlock((pthread_rwlock_t *)__rwlock);
  if (LVar1.fid == -2000000000) {
    pFVar2 = (FederateState *)0x0;
  }
  else {
    pFVar2 = *(FederateState **)
              ((long)&(this->loopFederates).dataStorage.dataptr[(ulong)(long)LVar1.fid >> 5]->fed +
              (ulong)((LVar1.fid & 0x1fU) << 4));
  }
  return pFVar2;
}

Assistant:

FederateState* CommonCore::getHandleFederateCore(InterfaceHandle handle)
{
    auto local_fed_id = handles.read([handle](auto& hand) { return hand.getLocalFedID(handle); });
    if (local_fed_id.isValid()) {
        return loopFederates[local_fed_id.baseValue()].fed;
    }

    return nullptr;
}